

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O1

void __thiscall
duckdb::LocalTableStorage::AppendToIndexes
          (LocalTableStorage *this,DuckTransaction *transaction,TableAppendState *append_state,
          bool append_to_table)

{
  DataTable *this_00;
  RowGroupCollection *pRVar1;
  DataTableInfo *pDVar2;
  type source;
  unsigned_long start_row;
  undefined7 in_register_00000009;
  shared_ptr<duckdb::DataTableInfo,_true> data_table_info;
  row_t current_row;
  ErrorData error;
  shared_ptr<duckdb::DataTableInfo,_true> local_160;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_150;
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_120;
  _Alloc_hider local_110;
  char local_100 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0 [64];
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  char local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  this_00 = (this->table_ref)._M_data;
  if ((int)CONCAT71(in_register_00000009,append_to_table) == 0) {
    ErrorData::ErrorData((ErrorData *)local_b0);
    local_160.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this_00->info).internal.
           super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_160.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this_00->info).internal.
         super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_160.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_160.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_160.internal.
              super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_160.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_160.internal.
              super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    pDVar2 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&local_160);
    source = shared_ptr<duckdb::RowGroupCollection,_true>::operator*(&this->row_groups);
    DataTable::GetTypes((vector<duckdb::LogicalType,_true> *)&local_150,this_00);
    AppendToIndexes((ErrorData *)local_138,this,transaction,source,&pDVar2->indexes,
                    (vector<duckdb::LogicalType,_true> *)&local_150,&append_state->current_row);
    local_b0._0_2_ = local_138._0_2_;
    ::std::__cxx11::string::operator=((string *)&local_a8,(string *)(local_138 + 8));
    ::std::__cxx11::string::operator=((string *)&local_88,(string *)&local_110);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(local_68,local_f0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_f0);
    if (local_110._M_p != local_100) {
      operator_delete(local_110._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._8_8_ != &aStack_120) {
      operator_delete((void *)local_138._8_8_);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_150);
    if (local_160.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_160.internal.
                 super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  else {
    DataTable::InitializeAppend(this_00,transaction,append_state);
    ErrorData::ErrorData((ErrorData *)local_b0);
    pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
    local_128 = (undefined1  [8])0x0;
    aStack_120._M_allocated_capacity = 0;
    local_138._0_8_ = (void *)0x0;
    local_138._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_138._0_8_ = operator_new(0x20);
    *(ErrorData **)local_138._0_8_ = (ErrorData *)local_b0;
    *(DataTable **)(local_138._0_8_ + 8) = this_00;
    *(LocalTableStorage **)(local_138._0_8_ + 0x10) = this;
    *(TableAppendState **)(local_138._0_8_ + 0x18) = append_state;
    aStack_120._M_allocated_capacity =
         (size_type)
         ::std::
         _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:183:33)>
         ::_M_invoke;
    local_128 = (undefined1  [8])
                ::std::
                _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:183:33)>
                ::_M_manager;
    RowGroupCollection::Scan(pRVar1,transaction,(function<bool_(duckdb::DataChunk_&)> *)local_138);
    if (local_128 != (undefined1  [8])0x0) {
      (*(code *)local_128)(local_138,local_138,3);
    }
  }
  if (local_b0[0] != true) {
    if (append_to_table) {
      DataTable::FinalizeAppend(this_00,transaction,append_state);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_68);
    if (local_88._M_p != local_78) {
      operator_delete(local_88._M_p);
    }
    if (local_a8._M_p != local_98) {
      operator_delete(local_a8._M_p);
    }
    return;
  }
  local_150.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)append_state->row_start;
  pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  local_128 = (undefined1  [8])0x0;
  aStack_120._M_allocated_capacity = 0;
  local_138._0_8_ = (void *)0x0;
  local_138._8_8_ = 0;
  local_138._0_8_ = operator_new(0x20);
  *(DataTable **)local_138._0_8_ = this_00;
  *(TableAppendState **)(local_138._0_8_ + 8) = append_state;
  *(vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> **)(local_138._0_8_ + 0x10) =
       &local_150;
  *(undefined1 **)(local_138._0_8_ + 0x18) = local_b0;
  aStack_120._M_allocated_capacity =
       (size_type)
       ::std::
       _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:203:33)>
       ::_M_invoke;
  local_128 = (undefined1  [8])
              ::std::
              _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:203:33)>
              ::_M_manager;
  RowGroupCollection::Scan(pRVar1,transaction,(function<bool_(duckdb::DataChunk_&)> *)local_138);
  if (local_128 != (undefined1  [8])0x0) {
    (*(code *)local_128)(local_138,local_138,3);
  }
  if (append_to_table) {
    start_row = NumericCastImpl<unsigned_long,_long,_false>::Convert(append_state->row_start);
    pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this_00->row_groups);
    RowGroupCollection::RevertAppendInternal(pRVar1,start_row);
  }
  local_138._0_8_ = local_128;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_138,anon_var_dwarf_63b5960 + 9);
  ErrorData::Throw((ErrorData *)local_b0,(string *)local_138);
}

Assistant:

void LocalTableStorage::AppendToIndexes(DuckTransaction &transaction, TableAppendState &append_state,
                                        bool append_to_table) {
	auto &table = table_ref.get();
	if (append_to_table) {
		table.InitializeAppend(transaction, append_state);
	}
	ErrorData error;
	if (append_to_table) {
		// appending: need to scan entire
		row_groups->Scan(transaction, [&](DataChunk &chunk) -> bool {
			// append this chunk to the indexes of the table
			error = table.AppendToIndexes(delete_indexes, chunk, append_state.current_row, index_append_mode);
			if (error.HasError()) {
				return false;
			}
			// append to base table
			table.Append(chunk, append_state);
			return true;
		});
	} else {
		auto data_table_info = table.GetDataTableInfo();
		auto &index_list = data_table_info->GetIndexes();
		error = AppendToIndexes(transaction, *row_groups, index_list, table.GetTypes(), append_state.current_row);
	}

	if (error.HasError()) {
		// need to revert all appended row ids
		row_t current_row = append_state.row_start;
		// remove the data from the indexes, if there are any indexes
		row_groups->Scan(transaction, [&](DataChunk &chunk) -> bool {
			// Remove this chunk from the indexes.
			try {
				table.RemoveFromIndexes(append_state, chunk, current_row);
			} catch (std::exception &ex) { // LCOV_EXCL_START
				error = ErrorData(ex);
				return false;
			} // LCOV_EXCL_STOP

			current_row += UnsafeNumericCast<row_t>(chunk.size());
			if (current_row >= append_state.current_row) {
				// finished deleting all rows from the index: abort now
				return false;
			}
			return true;
		});
		if (append_to_table) {
			table.RevertAppendInternal(NumericCast<idx_t>(append_state.row_start));
		}
#ifdef DEBUG
		// Verify that our index memory is stable.
		table.VerifyIndexBuffers();
#endif
		error.Throw();
	}
	if (append_to_table) {
		table.FinalizeAppend(transaction, append_state);
	}
}